

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsOnListOfPiecesOfCinematography.h
# Opt level: O0

void OperationsOnListOfPiecesOfCinematography<Series>::addPiece
               (Series *piece,
               vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_> *list)

{
  Livestream *this;
  bool bVar1;
  int iVar2;
  int duration_00;
  size_type sVar3;
  ostream *poVar4;
  char *pcVar5;
  CustomException *pCVar6;
  istream *piVar7;
  reference ppPVar8;
  ulong uVar9;
  double rating_00;
  Livestream *local_3f8;
  Series *local_3b8;
  CustomException *e;
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8 [39];
  byte local_281;
  string local_280 [39];
  byte local_259;
  string local_258 [32];
  string local_238 [8];
  string hour;
  allocator local_211;
  string local_210 [32];
  int local_1f0;
  undefined1 local_1ea;
  allocator local_1e9;
  int day;
  int local_1c4;
  Livestream *pLStack_1c0;
  int month;
  Livestream *l;
  string local_1b0 [36];
  int local_18c;
  Series *pSStack_188;
  int yearTheShowEnded;
  Series *s;
  undefined1 local_172;
  allocator local_171;
  string local_170 [38];
  undefined1 local_14a;
  allocator local_149;
  string local_148 [38];
  undefined1 local_122;
  allocator local_121;
  string local_120 [38];
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [48];
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genres;
  string inputValue;
  string local_70 [8];
  string genre;
  int duration;
  int yearProduced;
  int numberOfVotes;
  double rating;
  string title;
  vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_> *list_local;
  Series *piece_local;
  
  std::__cxx11::string::string((string *)&rating);
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::string
            ((string *)
             &genres.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a8);
  PieceOfCinematography::setFollowed(&piece->super_PieceOfCinematography,false);
  sVar3 = std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::size(list)
  ;
  PieceOfCinematography::setId(&piece->super_PieceOfCinematography,(int)sVar3 + 1);
  poVar4 = std::operator<<((ostream *)&std::cout,"set the title of the piece of cinematography:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,(string *)&rating);
  std::__cxx11::string::string(local_d8,(string *)&rating);
  PieceOfCinematography::setTitle(&piece->super_PieceOfCinematography,(string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  poVar4 = std::operator<<((ostream *)&std::cout,"set the rating for the piece of cinematography:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,
                  (string *)
                  &genres.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  rating_00 = atof(pcVar5);
  if ((10.0 < rating_00) || (rating_00 < 0.0)) {
    local_fa = 1;
    pCVar6 = (CustomException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"wrong rating",&local_f9);
    CustomException::CustomException(pCVar6,(string *)local_f8);
    local_fa = 0;
    __cxa_throw(pCVar6,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setRating(&piece->super_PieceOfCinematography,rating_00);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "set the number of votes for the piece of cinematography:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,
                  (string *)
                  &genres.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(pcVar5);
  if (iVar2 < 0) {
    local_122 = 1;
    pCVar6 = (CustomException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"Number of votes can not be lower than 0",&local_121);
    CustomException::CustomException(pCVar6,(string *)local_120);
    local_122 = 0;
    __cxa_throw(pCVar6,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setNumberOfVotes(&piece->super_PieceOfCinematography,iVar2);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "set the year of production for the piece of cinematography:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,
                  (string *)
                  &genres.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(pcVar5);
  if (iVar2 < 0) {
    local_14a = 1;
    pCVar6 = (CustomException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"Year of production can not be lower than 0",&local_149);
    CustomException::CustomException(pCVar6,(string *)local_148);
    local_14a = 0;
    __cxa_throw(pCVar6,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setYearProduced(&piece->super_PieceOfCinematography,iVar2);
  poVar4 = std::operator<<((ostream *)&std::cout,"set the duration of the piece of cinematography:")
  ;
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,
                  (string *)
                  &genres.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  duration_00 = atoi(pcVar5);
  if (duration_00 < 0) {
    local_172 = 1;
    pCVar6 = (CustomException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"Duration can not be lower than 0",&local_171);
    CustomException::CustomException(pCVar6,(string *)local_170);
    local_172 = 0;
    __cxa_throw(pCVar6,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setDuration(&piece->super_PieceOfCinematography,duration_00);
  poVar4 = std::operator<<((ostream *)&std::cout,"set the genres of the piece of cinematography:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"To set each genre type it and then press enter.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "To finish setting the genres type \"apply\" and press enter.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  while( true ) {
    piVar7 = std::operator>>((istream *)&std::cin,local_70);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if ((!bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_70,"apply"), bVar1)) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,(value_type *)local_70);
  }
  PieceOfCinematography::setGenres
            (&piece->super_PieceOfCinematography,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8);
  s = piece;
  std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::push_back
            (list,(value_type *)&s);
  sVar3 = std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::size(list)
  ;
  ppPVar8 = std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::
            operator[](list,sVar3 - 1);
  bVar1 = instanceof<Series,PieceOfCinematography>(*ppPVar8);
  if (bVar1) {
    sVar3 = std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::size
                      (list);
    ppPVar8 = std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::
              operator[](list,sVar3 - 1);
    if (*ppPVar8 == (value_type)0x0) {
      local_3b8 = (Series *)0x0;
    }
    else {
      local_3b8 = (Series *)
                  __dynamic_cast(*ppPVar8,&PieceOfCinematography::typeinfo,&Series::typeinfo,0);
    }
    pSStack_188 = local_3b8;
    local_18c = 0;
    poVar4 = std::operator<<((ostream *)&std::cout,"set the year the show ended:");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,
                    (string *)
                    &genres.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    local_18c = atoi(pcVar5);
    if (local_18c < 0) {
      std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::pop_back(list)
      ;
      l._6_1_ = 1;
      pCVar6 = (CustomException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b0,"Year the show ended can not be lower than 0",(allocator *)((long)&l + 7)
                );
      CustomException::CustomException(pCVar6,(string *)local_1b0);
      l._6_1_ = 0;
      __cxa_throw(pCVar6,&CustomException::typeinfo,CustomException::~CustomException);
    }
    Series::setYearTheShowEnded(pSStack_188,local_18c);
    Series::setNumberOfSeasons(pSStack_188,(local_18c - iVar2) + 1);
  }
  else {
    sVar3 = std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::size
                      (list);
    ppPVar8 = std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::
              operator[](list,sVar3 - 1);
    bVar1 = instanceof<Livestream,PieceOfCinematography>(*ppPVar8);
    if (bVar1) {
      sVar3 = std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::size
                        (list);
      ppPVar8 = std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::
                operator[](list,sVar3 - 1);
      if (*ppPVar8 == (value_type)0x0) {
        local_3f8 = (Livestream *)0x0;
      }
      else {
        local_3f8 = (Livestream *)
                    __dynamic_cast(*ppPVar8,&PieceOfCinematography::typeinfo,&Livestream::typeinfo,0
                                  );
      }
      pLStack_1c0 = local_3f8;
      poVar4 = std::operator<<((ostream *)&std::cout,"set the month of livestream: ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::operator>>((istream *)&std::cin,
                      (string *)
                      &genres.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_1c4 = atoi(pcVar5);
      if ((local_1c4 < 1) || (0xc < local_1c4)) {
        std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::pop_back
                  (list);
        local_1ea = 1;
        pCVar6 = (CustomException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&day,"Invalid month",&local_1e9);
        CustomException::CustomException(pCVar6,(string *)&day);
        local_1ea = 0;
        __cxa_throw(pCVar6,&CustomException::typeinfo,CustomException::~CustomException);
      }
      Livestream::setMonth(pLStack_1c0,local_1c4);
      poVar4 = std::operator<<((ostream *)&std::cout,"set the day of livestream: ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::operator>>((istream *)&std::cin,
                      (string *)
                      &genres.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_1f0 = atoi(pcVar5);
      if ((local_1f0 < 1) || (0x1f < local_1f0)) {
        std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::pop_back
                  (list);
        pCVar6 = (CustomException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_210,"Invalid day",&local_211);
        CustomException::CustomException(pCVar6,(string *)local_210);
        __cxa_throw(pCVar6,&CustomException::typeinfo,CustomException::~CustomException);
      }
      Livestream::setDay(pLStack_1c0,local_1f0);
      std::__cxx11::string::string(local_238);
      poVar4 = std::operator<<((ostream *)&std::cout,"set hour of livestream hh:mm e. g. \"21:37\"")
      ;
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::operator>>((istream *)&std::cin,local_238);
      uVar9 = std::__cxx11::string::size();
      local_259 = 0;
      local_281 = 0;
      bVar1 = true;
      if (uVar9 < 6) {
        std::__cxx11::string::substr((ulong)local_258,(ulong)local_238);
        local_259 = 1;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        iVar2 = atoi(pcVar5);
        bVar1 = true;
        if (iVar2 < 0x18) {
          std::__cxx11::string::substr((ulong)local_280,(ulong)local_238);
          local_281 = 1;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          iVar2 = atoi(pcVar5);
          bVar1 = true;
          if (iVar2 < 0x3c) {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_238);
            bVar1 = *pcVar5 != ':';
          }
        }
      }
      if ((local_281 & 1) != 0) {
        std::__cxx11::string::~string(local_280);
      }
      if ((local_259 & 1) != 0) {
        std::__cxx11::string::~string(local_258);
      }
      this = pLStack_1c0;
      if (bVar1) {
        std::vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>::pop_back
                  (list);
        local_2aa = 1;
        pCVar6 = (CustomException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2a8,"Invalid hour",&local_2a9);
        CustomException::CustomException(pCVar6,(string *)local_2a8);
        local_2aa = 0;
        __cxa_throw(pCVar6,&CustomException::typeinfo,CustomException::~CustomException);
      }
      std::__cxx11::string::string((string *)&e,local_238);
      Livestream::setHour(this,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string(local_238);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a8);
  std::__cxx11::string::~string
            ((string *)
             &genres.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&rating);
  return;
}

Assistant:

static void addPiece(T *piece, vector<PieceOfCinematography *> &list) {
        string title;
        double rating;
        int numberOfVotes, yearProduced, duration;
        string genre;
        string inputValue;
        vector<string> genres;
        try {
            piece->setFollowed(0);
            piece->setId(list.size() + 1);
            cout << "set the title of the piece of cinematography:" << endl;
            cin >> title;
            piece->setTitle(title);
            cout << "set the rating for the piece of cinematography:" << endl;
            cin >> inputValue;
            rating = atof(inputValue.c_str());
            if(rating>10 || rating<0) throw CustomException("wrong rating");
            piece->setRating(rating);
            cout << "set the number of votes for the piece of cinematography:" << endl;
            cin >> inputValue;
            numberOfVotes = atoi(inputValue.c_str());
            if(numberOfVotes<0) throw CustomException("Number of votes can not be lower than 0");
            piece->setNumberOfVotes(numberOfVotes);
            cout << "set the year of production for the piece of cinematography:" << endl;
            cin >> inputValue;
            yearProduced=atoi(inputValue.c_str());
            if(yearProduced<0) throw CustomException("Year of production can not be lower than 0");
            piece->setYearProduced(yearProduced);
            cout << "set the duration of the piece of cinematography:" << endl;
            cin >> inputValue;
            duration=atoi(inputValue.c_str());
            if(duration<0) throw CustomException("Duration can not be lower than 0");
            piece->setDuration(duration);
            cout << "set the genres of the piece of cinematography:" << endl;
            cout << "To set each genre type it and then press enter." << endl;
            cout << "To finish setting the genres type \"apply\" and press enter." << endl;
            while (cin >> genre) {
                if (genre == "apply") break;
                genres.push_back(genre);
            }
            piece->setGenres(genres);
            list.push_back(dynamic_cast<T *>(piece));
            if (instanceof<Series>(list[list.size() - 1])) {
                Series *s = dynamic_cast<Series *>(list[list.size() - 1]);
                int yearTheShowEnded = 0;
                cout << "set the year the show ended:" << endl;
                cin >> inputValue;
                yearTheShowEnded = atoi(inputValue.c_str());
                if(yearTheShowEnded<0){
                    list.pop_back();
                    throw CustomException("Year the show ended can not be lower than 0");
                }
                s->setYearTheShowEnded(yearTheShowEnded);
                s->setNumberOfSeasons(yearTheShowEnded - yearProduced + 1);
            } else if (instanceof<Livestream>(list[list.size() - 1])) {
                Livestream *l = dynamic_cast<Livestream *>(list[list.size() - 1]);
                int month;
                cout << "set the month of livestream: " << endl;
                cin >> inputValue;
                month = atoi(inputValue.c_str());
                if(month<1 || month >12){
                    list.pop_back();
                    throw CustomException("Invalid month");
                }
                l->setMonth(month);
                cout << "set the day of livestream: " << endl;
                int day;
                cin >> inputValue;
                day = atoi(inputValue.c_str());
                if(day<1 || day >31){
                    list.pop_back();
                    throw CustomException("Invalid day");
                }
                l->setDay(day);
                string hour;
                cout << "set hour of livestream hh:mm e. g. \"21:37\"" << endl;
                cin >> hour;
                if(hour.size()>5 || atoi(hour.substr(0,2).c_str())>23 || atoi(hour.substr(3,2).c_str())>59 || hour[2]!=':'){
                    list.pop_back();
                    throw CustomException("Invalid hour");
                }
                l->setHour(hour);
            }
        } catch(CustomException &e){
            cout<<e.getMessage()<<endl<<endl;
        }
    }